

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

void Gia_Iso2ManStop(Gia_Iso2Man_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  
  pVVar1 = p->vUniques;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTied;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTable;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPlaces;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  __ptr = p->vSingles;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  pVVar1 = p->vMap0;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vMap1;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vVec0;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vVec1;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  free(p);
  return;
}

Assistant:

void Gia_Iso2ManStop( Gia_Iso2Man_t * p )
{
    Vec_IntFree( p->vUniques );
    Vec_IntFree( p->vTied );
    Vec_IntFree( p->vTable );
    Vec_IntFree( p->vPlaces );
    Vec_PtrFree( p->vSingles );
    Vec_IntFree( p->vMap0 );
    Vec_IntFree( p->vMap1 );
    Vec_IntFree( p->vVec0 );
    Vec_IntFree( p->vVec1 );
    ABC_FREE( p );
}